

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAutoHandle.cxx
# Opt level: O3

ssize_t __thiscall
auto_async_t::send(auto_async_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uv_async_t *handle;
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->handleMutex);
  if (iVar1 == 0) {
    handle = (this->super_auto_handle_<uv_async_s>).super_auto_handle_base_<uv_async_s>.handle;
    if (handle != (uv_async_t *)0x0) {
      uv_async_send(handle);
    }
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->handleMutex);
    return CONCAT44(extraout_var,iVar1);
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void auto_async_t::send()
{
  std::lock_guard<std::mutex> lock(handleMutex);
  if (this->handle) {
    uv_async_send(*this);
  }
}